

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

void Split_Cubic(TPoint *base)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  base[6].x = base[3].x;
  lVar2 = base[1].x;
  lVar3 = base[1].y;
  lVar4 = lVar2 + 1 + base->x >> 1;
  base[1].x = lVar4;
  lVar1 = base[3].x + base[2].x + 1 >> 1;
  base[5].x = lVar1;
  lVar2 = base[2].x + lVar2 + 1 >> 1;
  lVar4 = lVar2 + lVar4 + 1 >> 1;
  base[2].x = lVar4;
  lVar2 = lVar1 + lVar2 + 1 >> 1;
  base[4].x = lVar2;
  base[3].x = lVar2 + lVar4 + 1 >> 1;
  base[6].y = base[3].y;
  lVar4 = lVar3 + 1 + base->y >> 1;
  base[1].y = lVar4;
  lVar1 = base[3].y + base[2].y + 1 >> 1;
  base[5].y = lVar1;
  lVar2 = lVar3 + base[2].y + 1 >> 1;
  lVar3 = lVar2 + lVar4 + 1 >> 1;
  base[2].y = lVar3;
  lVar2 = lVar2 + lVar1 + 1 >> 1;
  base[4].y = lVar2;
  base[3].y = lVar2 + lVar3 + 1 >> 1;
  return;
}

Assistant:

static void
  Split_Cubic( TPoint*  base )
  {
    Long  a, b, c, d;


    base[6].x = base[3].x;
    c = base[1].x;
    d = base[2].x;
    base[1].x = a = ( base[0].x + c + 1 ) >> 1;
    base[5].x = b = ( base[3].x + d + 1 ) >> 1;
    c = ( c + d + 1 ) >> 1;
    base[2].x = a = ( a + c + 1 ) >> 1;
    base[4].x = b = ( b + c + 1 ) >> 1;
    base[3].x = ( a + b + 1 ) >> 1;

    base[6].y = base[3].y;
    c = base[1].y;
    d = base[2].y;
    base[1].y = a = ( base[0].y + c + 1 ) >> 1;
    base[5].y = b = ( base[3].y + d + 1 ) >> 1;
    c = ( c + d + 1 ) >> 1;
    base[2].y = a = ( a + c + 1 ) >> 1;
    base[4].y = b = ( b + c + 1 ) >> 1;
    base[3].y = ( a + b + 1 ) >> 1;
  }